

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzerSettings.cpp
# Opt level: O2

bool __thiscall LINAnalyzerSettings::SetSettingsFromInterfaces(LINAnalyzerSettings *this)

{
  U32 UVar1;
  double dVar2;
  Channel aCStack_28 [16];
  
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::operator=(&this->mInputChannel,aCStack_28);
  Channel::~Channel(aCStack_28);
  dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
  this->mLINVersion = dVar2;
  UVar1 = AnalyzerSettingInterfaceInteger::GetInteger();
  this->mBitRate = UVar1;
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  return true;
}

Assistant:

bool LINAnalyzerSettings::SetSettingsFromInterfaces()
{
    mInputChannel = mInputChannelInterface->GetChannel();
    mLINVersion = mLINVersionInterface->GetNumber();
    mBitRate = mBitRateInterface->GetInteger();

    ClearChannels();
    AddChannel( mInputChannel, "LIN", true );

    return true;
}